

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<DataStream,std::vector<PrefilledTransaction,std::allocator<PrefilledTransaction>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *v)

{
  long lVar1;
  pointer pPVar2;
  value_type *elem;
  pointer pPVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<DataStream>
            (s,((long)(v->
                      super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(v->
                     super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pPVar2 = (v->super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pPVar3 = (v->super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>)
                ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar2; pPVar3 = pPVar3 + 1) {
    PrefilledTransaction::SerializationOps<DataStream,PrefilledTransaction_const,ActionSerialize>
              (pPVar3,s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }